

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O2

size_t ZSTD_compressBlock_lazy2_row
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  int *pInLimit;
  BYTE *pBVar1;
  undefined8 *puVar2;
  U32 UVar3;
  U32 *pUVar4;
  BYTE *pBVar5;
  seqDef *psVar6;
  undefined8 uVar7;
  U32 lowestValid;
  uint uVar8;
  uint uVar9;
  size_t sVar10;
  ulong uVar11;
  long lVar12;
  int *ip;
  int *piVar13;
  ulong uVar14;
  ZSTD_matchState_t *pZVar15;
  int *piVar16;
  int *iend;
  uint uVar17;
  uint uVar18;
  int iVar19;
  ulong uVar20;
  seqStore_t *psVar21;
  size_t offbaseFound;
  uint local_b8;
  uint local_b4;
  ulong local_b0;
  uint local_a8;
  uint local_a4;
  int *local_a0;
  ZSTD_matchState_t *local_98;
  int *local_90;
  uint local_84;
  long local_80;
  BYTE *local_78;
  int *local_70;
  uint local_64;
  uint local_60;
  uint local_5c;
  seqStore_t *local_58;
  int *local_50;
  size_t local_48;
  BYTE *local_40;
  uint *local_38;
  
  local_78 = (ms->window).base;
  uVar8 = (ms->window).dictLimit;
  local_40 = local_78 + uVar8;
  local_a4 = (ms->cParams).minMatch;
  if (5 < local_a4) {
    local_a4 = 6;
  }
  if (local_a4 < 5) {
    local_a4 = 4;
  }
  local_84 = (ms->cParams).searchLog;
  local_b8 = 6;
  if (local_84 < 6) {
    local_b8 = local_84;
  }
  if (local_b8 < 5) {
    local_b8 = 4;
  }
  ip = (int *)((ulong)((int)src == (int)local_40) + (long)src);
  uVar17 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  iVar19 = (int)ip - (int)local_78;
  local_60 = *rep;
  local_5c = iVar19 - uVar17;
  if (iVar19 - uVar8 <= uVar17) {
    local_5c = uVar8;
  }
  uVar17 = 0;
  if (ms->loadedDictEnd != 0) {
    local_5c = uVar8;
  }
  local_64 = rep[1];
  local_5c = iVar19 - local_5c;
  local_a8 = local_64;
  if (local_5c < local_64) {
    local_a8 = uVar17;
  }
  local_b4 = local_60;
  if (local_5c < local_60) {
    local_b4 = uVar17;
  }
  ms->lazySkipping = 0;
  local_70 = (int *)((long)src + (srcSize - 0x10));
  uVar8 = ms->nextToUpdate;
  uVar20 = (ulong)uVar8;
  uVar18 = ((int)local_70 - (int)(local_78 + uVar20)) + 1;
  if (7 < uVar18) {
    uVar18 = 8;
  }
  if (local_70 < local_78 + uVar20) {
    uVar18 = uVar17;
  }
  pInLimit = (int *)((long)src + srcSize);
  UVar3 = ms->rowHashLog;
  local_a0 = (int *)(ulong)(0x38 - UVar3);
  local_80 = CONCAT44(local_80._4_4_,0x18 - UVar3);
  local_48 = 1L << ((byte)local_b8 & 0x3f);
  local_b0 = CONCAT44(local_b0._4_4_,UVar3 + 8);
  pUVar4 = ms->hashTable;
  pBVar5 = ms->tagTable;
  local_98 = ms;
  local_90 = (int *)src;
  local_58 = seqStore;
  local_38 = rep;
  for (; uVar20 < uVar18 + uVar8; uVar20 = uVar20 + 1) {
    if (0x20 < (uint)local_b0) {
LAB_001c4953:
      __assert_fail("hBits <= 32",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x353,"size_t ZSTD_hashPtrSalted(const void *, U32, U32, const U64)");
    }
    if (local_a4 == 5) {
      uVar14 = *(long *)(local_78 + uVar20) * -0x30e4432345000000;
LAB_001c3e90:
      uVar14 = (uVar14 ^ local_98->hashSalt) >> ((byte)local_a0 & 0x3f);
    }
    else {
      if (local_a4 == 6) {
        uVar14 = *(long *)(local_78 + uVar20) * -0x30e4432340650000;
        goto LAB_001c3e90;
      }
      uVar14 = (ulong)((*(int *)(local_78 + uVar20) * -0x61c8864f ^ (uint)local_98->hashSalt) >>
                      ((byte)local_80 & 0x1f));
    }
    uVar17 = ((uint)(uVar14 >> 8) & 0xffffff) << ((byte)local_b8 & 0x1f);
    if (((ulong)(pUVar4 + uVar17) & 0x3f) != 0) {
LAB_001c4972:
      __assert_fail("ZSTD_isAligned(hashTable + relRow, 64)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                    ,0x32e,"void ZSTD_row_prefetch(const U32 *, const BYTE *, const U32, const U32)"
                   );
    }
    iVar19 = ZSTD_isAligned(pBVar5 + uVar17,local_48);
    if (iVar19 == 0) {
LAB_001c4991:
      __assert_fail("ZSTD_isAligned(tagTable + relRow, (size_t)1 << rowLog)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                    ,0x32f,"void ZSTD_row_prefetch(const U32 *, const BYTE *, const U32, const U32)"
                   );
    }
    local_98->hashCache[(uint)uVar20 & 7] = (U32)uVar14;
  }
  local_50 = pInLimit + -8;
  piVar16 = local_90;
  uVar17 = local_a4;
  uVar8 = local_b8;
  uVar18 = local_a8;
  do {
    local_a8 = uVar18;
    pZVar15 = local_98;
    local_80 = -(ulong)local_b4;
    local_90 = piVar16;
    while( true ) {
      if (local_70 <= ip) {
        if (local_64 <= local_5c) {
          local_64 = 0;
        }
        uVar8 = local_64;
        if (local_b4 != 0) {
          uVar8 = local_60;
        }
        if (local_60 <= local_5c) {
          uVar8 = local_64;
          local_60 = 0;
        }
        if (local_b4 != 0) {
          local_60 = local_b4;
        }
        if (local_a8 != 0) {
          uVar8 = local_a8;
        }
        *local_38 = local_60;
        local_38[1] = uVar8;
        return (long)pInLimit - (long)local_90;
      }
      if (local_b4 == 0) {
        uVar20 = 0;
      }
      else {
        uVar20 = 0;
        if (*(int *)((long)ip + local_80 + 1) == *(int *)((long)ip + 1)) {
          sVar10 = ZSTD_count((BYTE *)((long)ip + 5),(BYTE *)((long)ip + local_80 + 5),
                              (BYTE *)pInLimit);
          uVar20 = sVar10 + 4;
        }
      }
      offbaseFound = 999999999;
      if (uVar17 == 6) {
        if (uVar8 == 6) {
          uVar14 = ZSTD_RowFindBestMatch_noDict_6_6
                             (pZVar15,(BYTE *)ip,(BYTE *)pInLimit,&offbaseFound);
        }
        else if (uVar8 == 5) {
          uVar14 = ZSTD_RowFindBestMatch_noDict_6_5
                             (pZVar15,(BYTE *)ip,(BYTE *)pInLimit,&offbaseFound);
        }
        else {
          uVar14 = ZSTD_RowFindBestMatch_noDict_6_4
                             (pZVar15,(BYTE *)ip,(BYTE *)pInLimit,&offbaseFound);
        }
      }
      else if (uVar17 == 5) {
        if (uVar8 == 6) {
          uVar14 = ZSTD_RowFindBestMatch_noDict_5_6
                             (pZVar15,(BYTE *)ip,(BYTE *)pInLimit,&offbaseFound);
        }
        else if (uVar8 == 5) {
          uVar14 = ZSTD_RowFindBestMatch_noDict_5_5
                             (pZVar15,(BYTE *)ip,(BYTE *)pInLimit,&offbaseFound);
        }
        else {
          uVar14 = ZSTD_RowFindBestMatch_noDict_5_4
                             (pZVar15,(BYTE *)ip,(BYTE *)pInLimit,&offbaseFound);
        }
      }
      else if (uVar8 == 6) {
        uVar14 = ZSTD_RowFindBestMatch_noDict_4_6(pZVar15,(BYTE *)ip,(BYTE *)pInLimit,&offbaseFound)
        ;
      }
      else if (uVar8 == 5) {
        uVar14 = ZSTD_RowFindBestMatch_noDict_4_5(pZVar15,(BYTE *)ip,(BYTE *)pInLimit,&offbaseFound)
        ;
      }
      else {
        uVar14 = ZSTD_RowFindBestMatch_noDict_4_4(pZVar15,(BYTE *)ip,(BYTE *)pInLimit,&offbaseFound)
        ;
      }
      uVar11 = uVar20;
      if (uVar20 < uVar14) {
        uVar11 = uVar14;
      }
      if (3 < uVar11) break;
      uVar20 = (long)ip - (long)local_90;
      ip = (int *)((long)ip + (uVar20 >> 8) + 1);
      pZVar15->lazySkipping = (uint)(0x7ff < uVar20);
    }
    sVar10 = offbaseFound;
    if (uVar14 <= uVar20) {
      sVar10 = 1;
    }
    piVar16 = (int *)((long)ip + 1);
    if (uVar20 < uVar14) {
      piVar16 = ip;
    }
    while (piVar13 = ip, iend = piVar16, local_b0 = sVar10, uVar20 = uVar11, piVar13 < local_70) {
      ip = (int *)((long)piVar13 + 1);
      local_a0 = piVar16;
      if (sVar10 == 0) {
        local_b0 = 0;
      }
      else if ((local_b4 != 0) && (*ip == *(int *)((long)ip + local_80))) {
        sVar10 = ZSTD_count((BYTE *)((long)piVar13 + 5),(BYTE *)((long)piVar13 + local_80 + 5),
                            (BYTE *)pInLimit);
        uVar8 = ZSTD_highbit32((U32)local_b0);
        if ((sVar10 < 0xfffffffffffffffc) &&
           ((int)(((int)uVar11 * 3 - uVar8) + 1) < (int)(sVar10 + 4) * 3)) {
          local_b0 = 1;
          local_a0 = ip;
          uVar20 = sVar10 + 4;
        }
      }
      offbaseFound = 999999999;
      if (uVar17 == 6) {
        if (local_b8 == 6) {
          uVar11 = ZSTD_RowFindBestMatch_noDict_6_6
                             (pZVar15,(BYTE *)ip,(BYTE *)pInLimit,&offbaseFound);
        }
        else if (local_b8 == 5) {
          uVar11 = ZSTD_RowFindBestMatch_noDict_6_5
                             (pZVar15,(BYTE *)ip,(BYTE *)pInLimit,&offbaseFound);
        }
        else {
          uVar11 = ZSTD_RowFindBestMatch_noDict_6_4
                             (pZVar15,(BYTE *)ip,(BYTE *)pInLimit,&offbaseFound);
        }
      }
      else if (uVar17 == 5) {
        if (local_b8 == 6) {
          uVar11 = ZSTD_RowFindBestMatch_noDict_5_6
                             (pZVar15,(BYTE *)ip,(BYTE *)pInLimit,&offbaseFound);
        }
        else if (local_b8 == 5) {
          uVar11 = ZSTD_RowFindBestMatch_noDict_5_5
                             (pZVar15,(BYTE *)ip,(BYTE *)pInLimit,&offbaseFound);
        }
        else {
          uVar11 = ZSTD_RowFindBestMatch_noDict_5_4
                             (pZVar15,(BYTE *)ip,(BYTE *)pInLimit,&offbaseFound);
        }
      }
      else if (local_b8 == 6) {
        uVar11 = ZSTD_RowFindBestMatch_noDict_4_6(pZVar15,(BYTE *)ip,(BYTE *)pInLimit,&offbaseFound)
        ;
      }
      else if (local_b8 == 5) {
        uVar11 = ZSTD_RowFindBestMatch_noDict_4_5(pZVar15,(BYTE *)ip,(BYTE *)pInLimit,&offbaseFound)
        ;
      }
      else {
        uVar11 = ZSTD_RowFindBestMatch_noDict_4_4(pZVar15,(BYTE *)ip,(BYTE *)pInLimit,&offbaseFound)
        ;
      }
      sVar10 = offbaseFound;
      uVar18 = ZSTD_highbit32((U32)offbaseFound);
      uVar9 = ZSTD_highbit32((U32)local_b0);
      pZVar15 = local_98;
      uVar14 = local_b0;
      uVar8 = local_b8;
      uVar17 = local_a4;
      if ((uVar11 < 4) ||
         (piVar16 = ip, (int)((int)uVar11 * 4 - uVar18) <= (int)(((int)uVar20 * 4 - uVar9) + 4))) {
        iend = local_a0;
        if (local_70 <= ip) break;
        ip = (int *)((long)piVar13 + 2);
        if (local_b0 == 0) {
          local_b0 = 0;
        }
        else if ((local_b4 != 0) && (*ip == *(int *)((long)ip + local_80))) {
          sVar10 = ZSTD_count((BYTE *)((long)piVar13 + 6),(BYTE *)((long)piVar13 + local_80 + 6),
                              (BYTE *)pInLimit);
          uVar17 = ZSTD_highbit32((U32)uVar14);
          if ((sVar10 < 0xfffffffffffffffc) &&
             ((int)(((int)uVar20 * 4 + 1) - uVar17) < (int)(sVar10 + 4) * 4)) {
            local_b0 = 1;
            local_a0 = ip;
            uVar20 = sVar10 + 4;
          }
        }
        offbaseFound = 999999999;
        if (local_a4 == 6) {
          if (uVar8 == 6) {
            uVar11 = ZSTD_RowFindBestMatch_noDict_6_6
                               (pZVar15,(BYTE *)ip,(BYTE *)pInLimit,&offbaseFound);
          }
          else if (uVar8 == 5) {
            uVar11 = ZSTD_RowFindBestMatch_noDict_6_5
                               (pZVar15,(BYTE *)ip,(BYTE *)pInLimit,&offbaseFound);
          }
          else {
            uVar11 = ZSTD_RowFindBestMatch_noDict_6_4
                               (pZVar15,(BYTE *)ip,(BYTE *)pInLimit,&offbaseFound);
          }
        }
        else if (local_a4 == 5) {
          if (uVar8 == 6) {
            uVar11 = ZSTD_RowFindBestMatch_noDict_5_6
                               (pZVar15,(BYTE *)ip,(BYTE *)pInLimit,&offbaseFound);
          }
          else if (uVar8 == 5) {
            uVar11 = ZSTD_RowFindBestMatch_noDict_5_5
                               (pZVar15,(BYTE *)ip,(BYTE *)pInLimit,&offbaseFound);
          }
          else {
            uVar11 = ZSTD_RowFindBestMatch_noDict_5_4
                               (pZVar15,(BYTE *)ip,(BYTE *)pInLimit,&offbaseFound);
          }
        }
        else if (uVar8 == 6) {
          uVar11 = ZSTD_RowFindBestMatch_noDict_4_6
                             (pZVar15,(BYTE *)ip,(BYTE *)pInLimit,&offbaseFound);
        }
        else if (uVar8 == 5) {
          uVar11 = ZSTD_RowFindBestMatch_noDict_4_5
                             (pZVar15,(BYTE *)ip,(BYTE *)pInLimit,&offbaseFound);
        }
        else {
          uVar11 = ZSTD_RowFindBestMatch_noDict_4_4
                             (pZVar15,(BYTE *)ip,(BYTE *)pInLimit,&offbaseFound);
        }
        sVar10 = offbaseFound;
        uVar8 = ZSTD_highbit32((U32)offbaseFound);
        uVar18 = ZSTD_highbit32((U32)local_b0);
        pZVar15 = local_98;
        iend = local_a0;
        uVar17 = local_a4;
        if ((uVar11 < 4) ||
           (piVar16 = ip, (int)((int)uVar11 * 4 - uVar8) <= (int)(((int)uVar20 * 4 - uVar18) + 7)))
        break;
      }
    }
    psVar21 = local_58;
    uVar8 = local_b8;
    uVar18 = local_a8;
    if (3 < local_b0) {
      for (; ((local_90 < iend && (local_40 < (BYTE *)((long)iend + (3 - local_b0)))) &&
             (*(BYTE *)((long)iend + -1) == *(BYTE *)((long)iend + (2 - local_b0))));
          iend = (int *)((long)iend + -1)) {
        uVar20 = uVar20 + 1;
      }
      uVar18 = local_b4;
      local_b4 = (int)local_b0 - 3;
    }
    if (local_58->maxNbSeq <=
        (ulong)((long)local_58->sequences - (long)local_58->sequencesStart >> 3)) {
LAB_001c49ee:
      __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x29d,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    local_a8 = uVar18;
    if (0x20000 < local_58->maxNbLit) {
LAB_001c4a2c:
      __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x29f,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    uVar14 = (long)iend - (long)local_90;
    pBVar5 = local_58->lit;
    if (local_58->litStart + local_58->maxNbLit < pBVar5 + uVar14) {
LAB_001c4a0d:
      __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x2a0,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (pInLimit < iend) {
LAB_001c49cf:
      __assert_fail("literals + litLength <= litLimit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x2a1,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    local_a0 = iend;
    if (local_50 < iend) {
      ZSTD_safecopyLiterals(pBVar5,(BYTE *)local_90,(BYTE *)iend,(BYTE *)local_50);
LAB_001c4551:
      psVar21->lit = psVar21->lit + uVar14;
      if (0xffff < uVar14) {
        if (psVar21->longLengthType != ZSTD_llt_none) {
          __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2b2,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        psVar21->longLengthType = ZSTD_llt_literalLength;
        psVar21->longLengthPos =
             (U32)((ulong)((long)psVar21->sequences - (long)psVar21->sequencesStart) >> 3);
      }
    }
    else {
      uVar7 = *(undefined8 *)(local_90 + 2);
      *(undefined8 *)pBVar5 = *(undefined8 *)local_90;
      *(undefined8 *)(pBVar5 + 8) = uVar7;
      pBVar5 = local_58->lit;
      if (0x10 < uVar14) {
        if ((BYTE *)0xffffffffffffffe0 < pBVar5 + 0x10 + (-0x10 - (long)(local_90 + 4))) {
          __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/zstd_internal.h"
                        ,0xe9,
                        "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)")
          ;
        }
        uVar7 = *(undefined8 *)(local_90 + 6);
        *(undefined8 *)(pBVar5 + 0x10) = *(undefined8 *)(local_90 + 4);
        *(undefined8 *)(pBVar5 + 0x18) = uVar7;
        if (0x20 < (long)uVar14) {
          lVar12 = 0;
          do {
            puVar2 = (undefined8 *)((long)local_90 + lVar12 + 0x20);
            uVar7 = puVar2[1];
            pBVar1 = pBVar5 + lVar12 + 0x20;
            *(undefined8 *)pBVar1 = *puVar2;
            *(undefined8 *)(pBVar1 + 8) = uVar7;
            puVar2 = (undefined8 *)((long)local_90 + lVar12 + 0x30);
            uVar7 = puVar2[1];
            *(undefined8 *)(pBVar1 + 0x10) = *puVar2;
            *(undefined8 *)(pBVar1 + 0x18) = uVar7;
            lVar12 = lVar12 + 0x20;
          } while (pBVar1 + 0x20 < pBVar5 + uVar14);
        }
        goto LAB_001c4551;
      }
      local_58->lit = pBVar5 + uVar14;
    }
    psVar6 = psVar21->sequences;
    psVar6->litLength = (U16)uVar14;
    psVar6->offBase = (U32)local_b0;
    if (uVar20 < 3) {
LAB_001c49b0:
      __assert_fail("matchLength >= MINMATCH",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,700,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (0xffff < uVar20 - 3) {
      if (psVar21->longLengthType != ZSTD_llt_none) {
LAB_001c4a4b:
        __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,0x2bf,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      psVar21->longLengthType = ZSTD_llt_matchLength;
      psVar21->longLengthPos = (U32)((ulong)((long)psVar6 - (long)psVar21->sequencesStart) >> 3);
    }
    psVar6->mlBase = (U16)(uVar20 - 3);
    psVar21->sequences = psVar6 + 1;
    if (pZVar15->lazySkipping != 0) {
      uVar8 = pZVar15->nextToUpdate;
      uVar14 = (ulong)uVar8;
      UVar3 = pZVar15->rowHashLog;
      uVar17 = ((int)local_70 - (int)(local_78 + uVar14)) + 1;
      if (7 < uVar17) {
        uVar17 = 8;
      }
      if (local_70 < local_78 + uVar14) {
        uVar17 = 0;
      }
      pUVar4 = pZVar15->hashTable;
      pBVar5 = pZVar15->tagTable;
      local_b0 = CONCAT44(local_b0._4_4_,UVar3 + 8);
      local_90 = (int *)(ulong)(0x38 - UVar3);
      local_80 = CONCAT44(local_80._4_4_,0x18 - UVar3);
      for (; uVar14 < uVar17 + uVar8; uVar14 = uVar14 + 1) {
        if (0x20 < (uint)local_b0) goto LAB_001c4953;
        if (local_a4 == 5) {
          uVar11 = *(long *)(local_78 + uVar14) * -0x30e4432345000000;
LAB_001c4720:
          uVar11 = (uVar11 ^ local_98->hashSalt) >> ((byte)local_90 & 0x3f);
        }
        else {
          if (local_a4 == 6) {
            uVar11 = *(long *)(local_78 + uVar14) * -0x30e4432340650000;
            goto LAB_001c4720;
          }
          uVar11 = (ulong)((*(int *)(local_78 + uVar14) * -0x61c8864f ^ (uint)local_98->hashSalt) >>
                          ((byte)local_80 & 0x1f));
        }
        uVar18 = ((uint)(uVar11 >> 8) & 0xffffff) << ((byte)local_b8 & 0x1f);
        if (((ulong)(pUVar4 + uVar18) & 0x3f) != 0) goto LAB_001c4972;
        iVar19 = ZSTD_isAligned(pBVar5 + uVar18,local_48);
        if (iVar19 == 0) goto LAB_001c4991;
        local_98->hashCache[(uint)uVar14 & 7] = (U32)uVar11;
      }
      local_98->lazySkipping = 0;
      psVar21 = local_58;
      uVar17 = local_a4;
      uVar8 = local_b8;
    }
    uVar9 = local_a8;
    for (ip = (int *)((long)local_a0 + uVar20);
        ((uVar18 = uVar9, piVar16 = ip, uVar18 != 0 && (ip <= local_70)) &&
        (*ip == *(int *)((long)ip - (ulong)uVar18))); ip = (int *)((long)ip + sVar10 + 4)) {
      sVar10 = ZSTD_count((BYTE *)(ip + 1),(BYTE *)((long)ip + (4 - (ulong)uVar18)),(BYTE *)pInLimit
                         );
      if (psVar21->maxNbSeq <=
          (ulong)((long)psVar21->sequences - (long)psVar21->sequencesStart >> 3)) goto LAB_001c49ee;
      if (0x20000 < psVar21->maxNbLit) goto LAB_001c4a2c;
      pBVar5 = psVar21->lit;
      if (psVar21->litStart + psVar21->maxNbLit < pBVar5) goto LAB_001c4a0d;
      if (pInLimit < ip) goto LAB_001c49cf;
      if (local_50 < ip) {
        ZSTD_safecopyLiterals(pBVar5,(BYTE *)ip,(BYTE *)ip,(BYTE *)local_50);
      }
      else {
        uVar7 = *(undefined8 *)(ip + 2);
        *(undefined8 *)pBVar5 = *(undefined8 *)ip;
        *(undefined8 *)(pBVar5 + 8) = uVar7;
      }
      psVar6 = psVar21->sequences;
      psVar6->litLength = 0;
      psVar6->offBase = 1;
      if (sVar10 + 4 < 3) goto LAB_001c49b0;
      if (0xffff < sVar10 + 1) {
        if (psVar21->longLengthType != ZSTD_llt_none) goto LAB_001c4a4b;
        psVar21->longLengthType = ZSTD_llt_matchLength;
        psVar21->longLengthPos = (U32)((ulong)((long)psVar6 - (long)psVar21->sequencesStart) >> 3);
      }
      psVar6->mlBase = (U16)(sVar10 + 1);
      psVar21->sequences = psVar6 + 1;
      uVar9 = local_b4;
      local_b4 = uVar18;
    }
  } while( true );
}

Assistant:

size_t ZSTD_compressBlock_lazy2_row(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_rowHash, 2, ZSTD_noDict);
}